

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeMemMove(Mem *pTo,Mem *pFrom)

{
  MemValue MVar1;
  char *pcVar2;
  sqlite3 *psVar3;
  char *pcVar4;
  u32 uVar5;
  int iVar6;
  u16 uVar7;
  u8 uVar8;
  u8 uVar9;
  
  sqlite3VdbeMemRelease(pTo);
  pTo->xDel = pFrom->xDel;
  MVar1 = pFrom->u;
  pcVar2 = pFrom->z;
  iVar6 = pFrom->n;
  uVar7 = pFrom->flags;
  uVar8 = pFrom->enc;
  uVar9 = pFrom->eSubtype;
  psVar3 = pFrom->db;
  uVar5 = pFrom->uTemp;
  pcVar4 = pFrom->zMalloc;
  pTo->szMalloc = pFrom->szMalloc;
  pTo->uTemp = uVar5;
  pTo->zMalloc = pcVar4;
  pTo->n = iVar6;
  pTo->flags = uVar7;
  pTo->enc = uVar8;
  pTo->eSubtype = uVar9;
  pTo->db = psVar3;
  pTo->u = MVar1;
  pTo->z = pcVar2;
  pFrom->flags = 1;
  pFrom->szMalloc = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemMove(Mem *pTo, Mem *pFrom){
  assert( pFrom->db==0 || sqlite3_mutex_held(pFrom->db->mutex) );
  assert( pTo->db==0 || sqlite3_mutex_held(pTo->db->mutex) );
  assert( pFrom->db==0 || pTo->db==0 || pFrom->db==pTo->db );

  sqlite3VdbeMemRelease(pTo);
  memcpy(pTo, pFrom, sizeof(Mem));
  pFrom->flags = MEM_Null;
  pFrom->szMalloc = 0;
}